

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding2.c
# Opt level: O1

char * alignof_type(char *type,size_t *align)

{
  byte bVar1;
  size_t sVar2;
  size_t *psVar3;
  size_t *psVar4;
  char *pcVar5;
  ulong uVar6;
  ulong uVar7;
  ulong *in_RSI;
  char *in_RDI;
  bool bVar8;
  size_t ignored;
  char *in_stack_ffffffffffffffd8;
  size_t *align_00;
  char *local_10;
  
  psVar3 = (size_t *)objc_skip_type_qualifiers(in_RDI);
  bVar1 = (byte)*psVar3;
  if (bVar1 < 0x5b) {
    if (bVar1 < 0x3a) {
      if (bVar1 != 0x23) {
        if (bVar1 == 0x28) {
          psVar4 = (size_t *)((long)psVar3 + 1);
          while( true ) {
            sVar2 = *psVar4;
            psVar4 = (size_t *)((long)psVar4 + 1);
            align_00 = psVar3;
            if ((char)sVar2 == '=') break;
            if ((char)sVar2 == ')') {
              return (char *)psVar4;
            }
          }
          while (psVar3 = psVar4, (char)*psVar3 != ')') {
            if ((char)*psVar3 == '\"') {
              do {
                psVar3 = (size_t *)((long)psVar3 + 1);
              } while (*(char *)psVar3 != '\"');
            }
            psVar4 = (size_t *)alignof_type(in_stack_ffffffffffffffd8,align_00);
          }
          goto switchD_00112353_caseD_3f;
        }
        if (bVar1 != 0x2a) goto switchD_00112353_caseD_41;
      }
      goto switchD_00112353_caseD_4c;
    }
    switch(bVar1) {
    case 0x3f:
      goto switchD_00112353_caseD_3f;
    case 0x40:
      uVar6 = 0x40;
      if (0x40 < *in_RSI) {
        uVar6 = *in_RSI;
      }
      *in_RSI = uVar6;
      if (*(char *)((long)psVar3 + 1) == '\"') {
        psVar4 = (size_t *)((long)psVar3 + 1);
        do {
          psVar3 = (size_t *)((long)psVar4 + 1);
          pcVar5 = (char *)((long)psVar4 + 1);
          psVar4 = psVar3;
        } while (*pcVar5 != '\"');
      }
      else if (*(char *)((long)psVar3 + 1) == '?') {
        if (*(char *)((long)psVar3 + 2) == '<') {
          psVar4 = (size_t *)((long)psVar3 + 2);
          do {
            psVar3 = (size_t *)((long)psVar4 + 1);
            pcVar5 = (char *)((long)psVar4 + 1);
            psVar4 = psVar3;
          } while (*pcVar5 != '>');
        }
        else {
          psVar3 = (size_t *)((long)psVar3 + 1);
        }
      }
      goto switchD_00112353_caseD_3f;
    case 0x41:
    case 0x45:
    case 0x46:
    case 0x47:
    case 0x48:
    case 0x4a:
    case 0x4b:
    case 0x4d:
    case 0x4e:
    case 0x4f:
    case 0x50:
    case 0x52:
      goto switchD_00112353_caseD_41;
    case 0x42:
    case 0x43:
      goto switchD_00112353_caseD_42;
    case 0x44:
      uVar6 = *in_RSI;
      bVar8 = uVar6 < 0x81;
      uVar7 = 0x80;
      break;
    case 0x49:
      goto switchD_00112353_caseD_49;
    case 0x53:
      goto switchD_00112353_caseD_53;
    default:
      if (bVar1 != 0x3a) goto switchD_00112353_caseD_41;
    case 0x4c:
    case 0x51:
switchD_00112353_caseD_4c:
      uVar6 = *in_RSI;
      bVar8 = uVar6 < 0x41;
      uVar7 = 0x40;
    }
  }
  else {
    psVar4 = psVar3;
    switch(bVar1) {
    case 0x5e:
      uVar6 = 0x40;
      if (0x40 < *in_RSI) {
        uVar6 = *in_RSI;
      }
      *in_RSI = uVar6;
      local_10 = (char *)0x0;
      pcVar5 = alignof_type(in_stack_ffffffffffffffd8,psVar3);
      return pcVar5;
    case 0x62:
      psVar3 = (size_t *)((long)psVar3 + 1);
      strtol((char *)psVar3,(char **)&stack0xffffffffffffffe0,10);
      pcVar5 = alignof_type(in_stack_ffffffffffffffd8,psVar3);
      strtol(pcVar5,(char **)&stack0xffffffffffffffe0,10);
      return pcVar5;
    case 99:
switchD_00112353_caseD_42:
      uVar6 = *in_RSI;
      bVar8 = uVar6 < 9;
      uVar7 = 8;
      break;
    case 100:
    case 0x6c:
    case 0x71:
      goto switchD_00112353_caseD_4c;
    case 0x66:
    case 0x69:
switchD_00112353_caseD_49:
      uVar6 = *in_RSI;
      bVar8 = uVar6 < 0x21;
      uVar7 = 0x20;
      break;
    case 0x6a:
      psVar4 = (size_t *)((long)psVar3 + 1);
      bVar1 = *(byte *)((long)psVar3 + 1);
      if (0x62 < bVar1) {
        switch(bVar1) {
        case 99:
          goto switchD_001124f4_caseD_63;
        case 100:
        case 0x6c:
        case 0x71:
          goto switchD_001124f4_caseD_64;
        default:
          goto switchD_001123bb_caseD_7b;
        case 0x66:
        case 0x69:
          goto switchD_001124f4_caseD_66;
        case 0x73:
switchD_001124f4_caseD_73:
          uVar6 = *in_RSI;
          bVar8 = uVar6 < 0x11;
          uVar7 = 0x10;
          goto LAB_00112613;
        }
      }
      switch(bVar1) {
      case 0x43:
switchD_001124f4_caseD_63:
        uVar6 = *in_RSI;
        bVar8 = uVar6 < 9;
        uVar7 = 8;
LAB_00112613:
        if (!bVar8) {
          uVar7 = uVar6;
        }
        *in_RSI = uVar7;
        return (char *)((long)psVar3 + 2);
      case 0x44:
        uVar6 = *in_RSI;
        bVar8 = uVar6 < 0x81;
        uVar7 = 0x80;
        goto LAB_00112613;
      case 0x49:
switchD_001124f4_caseD_66:
        uVar6 = *in_RSI;
        bVar8 = uVar6 < 0x21;
        uVar7 = 0x20;
        goto LAB_00112613;
      case 0x4c:
switchD_001124f4_caseD_64:
        uVar6 = *in_RSI;
        bVar8 = uVar6 < 0x41;
        uVar7 = 0x40;
        goto LAB_00112613;
      default:
        if (bVar1 == 0x51) goto switchD_001124f4_caseD_64;
        if (bVar1 == 0x53) goto switchD_001124f4_caseD_73;
      case 0x45:
      case 0x46:
      case 0x47:
      case 0x48:
      case 0x4a:
      case 0x4b:
switchD_001123bb_caseD_7b:
        psVar3 = (size_t *)((long)psVar4 + 1);
        while( true ) {
          sVar2 = *psVar3;
          psVar3 = (size_t *)((long)psVar3 + 1);
          if ((char)sVar2 == '=') break;
          if ((char)sVar2 == '}') {
            return (char *)psVar3;
          }
        }
        while ((char)*psVar3 != '}') {
          if ((char)*psVar3 == '\"') {
            do {
              psVar3 = (size_t *)((long)psVar3 + 1);
            } while (*(char *)psVar3 != '\"');
          }
          psVar3 = (size_t *)alignof_type(in_stack_ffffffffffffffd8,psVar4);
        }
      }
      goto switchD_00112353_caseD_3f;
    case 0x73:
switchD_00112353_caseD_53:
      uVar6 = *in_RSI;
      bVar8 = uVar6 < 0x11;
      uVar7 = 0x10;
      break;
    case 0x76:
      goto switchD_00112353_caseD_3f;
    case 0x7b:
      goto switchD_001123bb_caseD_7b;
    default:
      if (bVar1 == 0x5b) {
        local_10 = (char *)((long)psVar3 + 1);
        strtol(local_10,&local_10,10);
        psVar3 = (size_t *)alignof_type(in_stack_ffffffffffffffd8,psVar3);
        goto switchD_00112353_caseD_3f;
      }
    case 0x5f:
    case 0x60:
    case 0x61:
    case 0x65:
    case 0x67:
    case 0x68:
    case 0x6b:
    case 0x6d:
    case 0x6e:
    case 0x6f:
    case 0x70:
    case 0x72:
    case 0x74:
    case 0x75:
    case 0x77:
    case 0x78:
    case 0x79:
    case 0x7a:
switchD_00112353_caseD_41:
      abort();
    }
  }
  if (!bVar8) {
    uVar7 = uVar6;
  }
  *in_RSI = uVar7;
switchD_00112353_caseD_3f:
  return (char *)((long)psVar3 + 1);
}

Assistant:

static const char *alignof_type(const char *type, size_t *align)
{
	type = objc_skip_type_qualifiers(type);
	switch (*type)
	{
		// For all primitive types, we return the maximum of the new alignment
		// and the old one
#define APPLY_TYPE(typeName, name, capitalizedName, encodingChar) \
		case encodingChar:\
		{\
			*align = max((alignof(typeName) * 8), *align);\
			return type + 1;\
		}
#define NON_INTEGER_TYPES 1
#define SKIP_ID 1
#include "type_encoding_cases.h"
		case '@':
		{
			*align = max((alignof(id) * 8), *align);\
			return skip_object_extended_qualifiers(type) + 1;
		}
		case '?':
		case 'v': return type+1;
		case 'j':
		{
			type++;
			switch (*type)
			{
#define APPLY_TYPE(typeName, name, capitalizedName, encodingChar) \
		case encodingChar:\
		{\
			*align = max((alignof(_Complex typeName) * 8), *align);\
			return type + 1;\
		}
#include "type_encoding_cases.h"
			}
		}
		case '{':
		{
			const char *t = type;
			parse_struct(&t, (type_parser)alignof_type, align);
			return t;
		}
		case '(':
		{
			const char *t = type;
			parse_union(&t, (type_parser)alignof_type, align);
			return t;
		}
		case '[':
		{
			const char *t = type;
			parse_array(&t, (type_parser)alignof_type, &align);
			return t;
		}
		case 'b':
		{
			// Consume the b
			type++;
			// Ignore the offset
			strtol(type, (char**)&type, 10);
			// Alignment of a bitfield is the alignment of the type that
			// contains it
			type = alignof_type(type, align);
			// Ignore the number of bits
			strtol(type, (char**)&type, 10);
			return type;
		}
		case '^':
		{
			*align = max((alignof(void*) * 8), *align);
			// All pointers look the same to me.
			size_t ignored = 0;
			// Skip the definition of the pointeee type.
			return alignof_type(type+1, &ignored);
		}
	}
	abort();
	return NULL;
}